

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int __thiscall CVmUTF8Source::readc(CVmUTF8Source *this,void *buf0,size_t len)

{
  wchar_t wVar1;
  ulong uVar2;
  size_t sVar3;
  byte *p;
  
  uVar2 = this->charlen - this->charidx;
  if (len <= uVar2) {
    uVar2 = len;
  }
  p = (byte *)(this->str + this->byteidx);
  if (uVar2 != 0) {
    sVar3 = 0;
    do {
      wVar1 = utf8_ptr::s_getch((char *)p);
      if (L'ÿ' < wVar1) {
        err_throw(0x7e7);
      }
      *(char *)((long)buf0 + sVar3) = (char)wVar1;
      sVar3 = sVar3 + 1;
      p = p + (ulong)(((*p >> 5 & 1) != 0) + 1 & (uint)(*p >> 7) * 3) + 1;
      this->charidx = this->charidx + 1;
    } while (uVar2 != sVar3);
  }
  this->byteidx = (long)p - (long)this->str;
  return (int)uVar2;
}

Assistant:

virtual int readc(void *buf0, size_t len)
    {
        /* get the output buffer pointer as a character pointer */
        char *buf = (char *)buf0;
        
        /* 
         *   limit the length to the remaining number of characters from the
         *   current position 
         */
        size_t rem = charlen - charidx;
        if (len > rem)
            len = rem;

        /* do the copy */
        utf8_ptr p((char *)str + byteidx);
        for (size_t i = 0 ; i < len ; ++i, p.inc(), ++charidx)
        {
            /* get this character */
            wchar_t ch = p.getch();

            /* if it's outside of the 0..255 range, it's an error */
            if (ch > 255)
                err_throw(VMERR_NUM_OVERFLOW);

            /* store it */
            *buf++ = (char)ch;
        }

        /* calculate the new byte index */
        byteidx = (size_t)(p.getptr() - str);

        /* return the length we copied */
        return len;
    }